

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O0

hrgls_Status hrgls_APICreateParametersGetName(hrgls_APICreateParams params,char **returnName)

{
  char *pcVar1;
  hrgls_Status s;
  char **returnName_local;
  hrgls_APICreateParams params_local;
  
  if (params == (hrgls_APICreateParams)0x0) {
    params_local._4_4_ = 0x3ee;
  }
  else if (returnName == (char **)0x0) {
    params_local._4_4_ = 0x3e9;
  }
  else {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    *returnName = pcVar1;
    params_local._4_4_ = 0;
  }
  return params_local._4_4_;
}

Assistant:

hrgls_Status hrgls_APICreateParametersGetName(hrgls_APICreateParams params,
    const char **returnName)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    if (!params) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    if (!returnName) {
      return hrgls_STATUS_BAD_PARAMETER;
    }
    *returnName = params->name.c_str();

    return s;
  }